

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t driver::zeKernelDestroy(ze_kernel_handle_t hKernel)

{
  ze_pfnKernelDestroy_t pfnDestroy;
  ze_result_t result;
  ze_kernel_handle_t hKernel_local;
  
  pfnDestroy._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c690 != (code *)0x0) {
    pfnDestroy._4_4_ = (*DAT_0011c690)(hKernel);
  }
  return pfnDestroy._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelDestroy(
        ze_kernel_handle_t hKernel                      ///< [in][release] handle of the kernel object
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnDestroy = context.zeDdiTable.Kernel.pfnDestroy;
        if( nullptr != pfnDestroy )
        {
            result = pfnDestroy( hKernel );
        }
        else
        {
            // generic implementation

        }

        return result;
    }